

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::AssignObject(NULLCRef l,NULLCRef r)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  FastVector<char,_false,_false> *pFVar4;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if ((pEVar1->field_11).subType == l.ptr._4_4_) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    memcpy((void *)CONCAT124(l,in_stack_0000000c),&stack0x0000001c,(ulong)pEVar1->size);
  }
  else {
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),l.ptr._4_4_);
    pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    nullcThrowError("ERROR: can\'t assign value of type %s to a pointer of type %s",pcVar2,pcVar3);
  }
  return;
}

Assistant:

void NULLC::AssignObject(NULLCRef l, NULLCRef r)
{
	if(linker->exTypes[l.typeID].subType != r.typeID)
	{
		nullcThrowError("ERROR: can't assign value of type %s to a pointer of type %s", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return;
	}
	memcpy(l.ptr, &r.ptr, linker->exTypes[l.typeID].size);
}